

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O3

void __thiscall HMatrix::compute_vecT_matB(HMatrix *this,double *vec,int *base,HVector *result)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  double dVar12;
  
  HVector::clear(result);
  iVar8 = this->numRow;
  if (iVar8 < 1) {
    iVar10 = 0;
  }
  else {
    piVar3 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (result->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    iVar10 = 0;
    do {
      iVar1 = base[lVar9];
      if (iVar1 < this->numCol) {
        iVar2 = piVar5[iVar1];
        lVar11 = (long)iVar2;
        iVar1 = piVar5[(long)iVar1 + 1];
        dVar12 = 0.0;
        if (iVar2 < iVar1) {
          do {
            dVar12 = dVar12 + vec[piVar6[lVar11]] * pdVar7[lVar11];
            lVar11 = lVar11 + 1;
          } while (iVar1 != lVar11);
        }
      }
      else {
        dVar12 = vec[iVar1 - this->numCol];
      }
      if (1e-14 < ABS(dVar12)) {
        pdVar4[lVar9] = dVar12;
        lVar11 = (long)iVar10;
        iVar10 = iVar10 + 1;
        piVar3[lVar11] = (int)lVar9;
        iVar8 = this->numRow;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar8);
  }
  result->count = iVar10;
  return;
}

Assistant:

void HMatrix::compute_vecT_matB(const double *vec, const int *base,
        HVector *result) {
    result->clear();
    int resultCount = 0;
    int *resultIndex = &result->index[0];
    double *resultArray = &result->array[0];
    for (int i = 0; i < numRow; i++) {
        int iCol = base[i];
        double value = 0;
        if (iCol < numCol) {
            for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++)
                value += vec[Aindex[k]] * Avalue[k];
        } else {
            value = vec[iCol - numCol];
        }
        if (fabs(value) > HSOL_CONST_TINY) {
            resultArray[i] = value;
            resultIndex[resultCount++] = i;
        }
    }
    result->count = resultCount;
}